

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O3

void share_activate(ssh_sharing_state *sharestate,char *server_verstring)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  ssh_sharing_connstate *cs;
  bool bVar4;
  int index;
  
  bVar1 = true;
  do {
    bVar4 = bVar1;
    sVar2 = strcspn(server_verstring,"-");
    server_verstring = server_verstring + ((sVar2 + 1) - (ulong)(server_verstring[sVar2] == '\0'));
    bVar1 = false;
  } while (bVar4);
  pcVar3 = dupstr(server_verstring);
  sharestate->server_verstring = pcVar3;
  cs = (ssh_sharing_connstate *)index234(sharestate->connections,0);
  if (cs != (ssh_sharing_connstate *)0x0) {
    index = 1;
    do {
      if (cs->sent_verstring == true) {
        __assert_fail("!cs->sent_verstring",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c"
                      ,0x769,"void share_activate(ssh_sharing_state *, const char *)");
      }
      share_send_verstring(cs);
      cs = (ssh_sharing_connstate *)index234(sharestate->connections,index);
      index = index + 1;
    } while (cs != (ssh_sharing_connstate *)0x0);
  }
  return;
}

Assistant:

void share_activate(ssh_sharing_state *sharestate,
                    const char *server_verstring)
{
    /*
     * Indication from connection layer that we are now ready to begin
     * serving any downstreams that have already connected to us.
     */
    struct ssh_sharing_connstate *cs;
    int i;

    /*
     * Trim the server's version string down to just the software
     * version component, removing "SSH-2.0-" or whatever at the
     * front.
     */
    for (i = 0; i < 2; i++) {
        server_verstring += strcspn(server_verstring, "-");
        if (*server_verstring)
            server_verstring++;
    }

    sharestate->server_verstring = dupstr(server_verstring);

    for (i = 0; (cs = (struct ssh_sharing_connstate *)
                 index234(sharestate->connections, i)) != NULL; i++) {
        assert(!cs->sent_verstring);
        share_send_verstring(cs);
    }
}